

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_api.c
# Opt level: O3

int pcp_eval_flow_state(pcp_flow_t *flow,pcp_fstate_e *fstate)

{
  pcp_flow_state_e pVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  pcp_fstate_e pVar6;
  pcp_flow_t *fiter;
  
  if (flow == (pcp_flow_t *)0x0) {
    pVar6 = pcp_state_short_lifetime_error;
    iVar5 = 0;
    if (fstate == (pcp_fstate_e *)0x0) {
      return 0;
    }
  }
  else {
    bVar4 = false;
    bVar3 = false;
    bVar2 = false;
    iVar5 = 0;
    do {
      pVar1 = flow->state;
      if (pVar1 == pfs_wait_after_short_life_error) {
        iVar5 = iVar5 + 1;
      }
      else if (pVar1 == pfs_failed) {
        iVar5 = iVar5 + 1;
        bVar4 = true;
      }
      else if (pVar1 == pfs_wait_for_lifetime_renew) {
        iVar5 = iVar5 + 1;
        bVar3 = true;
      }
      else {
        bVar2 = true;
      }
      flow = flow->next_child;
    } while (flow != (pcp_flow_s *)0x0);
    if (fstate == (pcp_fstate_e *)0x0) {
      return iVar5;
    }
    if (bVar2) {
      pVar6 = (uint)bVar3 * 2;
    }
    else {
      pVar6 = pcp_state_succeeded;
      if (!bVar3) {
        pVar6 = pcp_state_failed - !bVar4;
      }
    }
  }
  *fstate = pVar6;
  return iVar5;
}

Assistant:

int pcp_eval_flow_state(pcp_flow_t *flow, pcp_fstate_e *fstate) {
    pcp_flow_t *fiter;
    int nexit_states = 0;
    int fpresent_no_exit_state = 0;
    int fsuccess = 0;
    int ffailed = 0;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    for (fiter = flow; fiter != NULL; fiter = fiter->next_child) {
        switch (fiter->state) {
        case pfs_wait_for_lifetime_renew:
            fsuccess = 1;
            ++nexit_states;
            break;
        case pfs_failed:
            ffailed = 1;
            ++nexit_states;
            break;
        case pfs_wait_after_short_life_error:
            ++nexit_states;
            break;
        default:
            fpresent_no_exit_state = 1;
            break;
        }
    }

    if (fstate) {
        if (fpresent_no_exit_state) {
            if (fsuccess) {
                *fstate = pcp_state_partial_result;
            } else {
                *fstate = pcp_state_processing;
            }
        } else {
            if (fsuccess) {
                *fstate = pcp_state_succeeded;
            } else if (ffailed) {
                *fstate = pcp_state_failed;
            } else {
                *fstate = pcp_state_short_lifetime_error;
            }
        }
    }

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return nexit_states;
}